

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O2

bool BasePort::ParseProtocol(char *arg,ProtocolType *protocol,ostream *ostr)

{
  bool bVar1;
  ostream *poVar2;
  ProtocolType PVar3;
  allocator<char> local_41;
  string name;
  
  if ((arg == (char *)0x0) || (*arg == '\0')) {
    poVar2 = std::operator<<(ostr,"ParseProtocol: no protocol provided");
    std::endl<char,std::char_traits<char>>(poVar2);
    return false;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&name,arg,&local_41);
  bVar1 = std::operator==(&name,"sequential-read-write");
  PVar3 = PROTOCOL_SEQ_RW;
  if ((!bVar1) && (bVar1 = std::operator==(&name,"srw"), !bVar1)) {
    bVar1 = std::operator==(&name,"sequential-read-broadcast-write");
    PVar3 = PROTOCOL_SEQ_R_BC_W;
    if ((!bVar1) && (bVar1 = std::operator==(&name,"srbw"), !bVar1)) {
      bVar1 = std::operator==(&name,"broadcast-read-write");
      PVar3 = PROTOCOL_BC_QRW;
      if ((((!bVar1) && (bVar1 = std::operator==(&name,"brw"), !bVar1)) &&
          (bVar1 = std::operator==(&name,"broadcast-query-read-write"), !bVar1)) &&
         (bVar1 = std::operator==(&name,"bqrw"), !bVar1)) {
        poVar2 = std::operator<<(ostr,"ParseProtocol: no protocol \"");
        poVar2 = std::operator<<(poVar2,(string *)&name);
        poVar2 = std::operator<<(poVar2,
                                 "\" is not supported, use sequential-read-write, srw, sequential-read-broadcast-write, srbw, broadcast-query-read-write or bqrw"
                                );
        std::endl<char,std::char_traits<char>>(poVar2);
        bVar1 = false;
        goto LAB_0010dfa9;
      }
    }
  }
  *protocol = PVar3;
  bVar1 = true;
LAB_0010dfa9:
  std::__cxx11::string::~string((string *)&name);
  return bVar1;
}

Assistant:

bool BasePort::ParseProtocol(const char * arg, ProtocolType & protocol,
                             std::ostream & ostr)
{
    // no option, using default
    if ((arg == 0) || (strlen(arg) == 0)) {
        ostr << "ParseProtocol: no protocol provided" << std::endl;
        return false;
    }
    // convert arg to string
    std::string name(arg);

    // this could likely be implemented using a static map
    if ((name == "sequential-read-write") ||
        (name == "srw")) {
        protocol = PROTOCOL_SEQ_RW;
        return true;
    } else if ((name == "sequential-read-broadcast-write") ||
               (name == "srbw")) {
        protocol = PROTOCOL_SEQ_R_BC_W;
        return true;
    } else if ((name == "broadcast-read-write") ||
               (name == "brw") ||
               (name == "broadcast-query-read-write") ||
               (name == "bqrw")) {
        protocol = PROTOCOL_BC_QRW;
        return true;
    }
    ostr << "ParseProtocol: no protocol \"" << name << "\" is not supported, use sequential-read-write, srw, sequential-read-broadcast-write, srbw, broadcast-query-read-write or bqrw" << std::endl;
    return false;
}